

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

float duckdb::TryCastCInternal<duckdb::hugeint_t,float,duckdb::TryCast>
                (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  undefined8 in_RAX;
  bool in_R8B;
  float fVar3;
  hugeint_t input;
  float result_value;
  float local_4;
  
  local_4 = (float)((ulong)in_RAX >> 0x20);
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (int64_t)&local_4;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  bVar2 = TryCast::Operation<duckdb::hugeint_t,float>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(float *)0x0,in_R8B);
  fVar3 = 0.0;
  if (bVar2) {
    fVar3 = local_4;
  }
  return fVar3;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}